

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unitroot.c
# Opt level: O1

void ur_pp2(double *x,int N,char *type,char *model,int lshort,int *klag,double *cval,double *cprobs,
           double *auxstat,int *laux,double *teststat)

{
  double dVar1;
  int iVar2;
  undefined1 auVar3 [16];
  double dVar4;
  int iVar5;
  double *res;
  double *res_00;
  reg_object obj;
  void *__ptr;
  double *pdVar6;
  void *__src;
  ulong uVar7;
  double *pdVar8;
  double *pdVar9;
  double *pdVar10;
  undefined4 in_register_00000034;
  size_t sVar11;
  int n;
  long lVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  uint uVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double *local_110;
  double *local_100;
  double *local_d0;
  double local_90;
  double sig;
  double dStack_80;
  double local_70;
  undefined1 local_68 [16];
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  double *local_38;
  
  dStack_80 = sig;
  local_68._8_8_ = local_68._0_8_;
  local_40 = (double)CONCAT44(in_register_00000034,N);
  local_50 = (double)CONCAT44(local_50._4_4_,N + -1);
  local_48 = (double)(N + -1);
  local_38 = x;
  dVar13 = pow(local_48 / 100.0,0.25);
  pdVar6 = (double *)
           (ulong)(uint)(int)(dVar13 * *(double *)(&DAT_00155c90 + (ulong)(lshort == 1) * 8));
  if ((klag != (int *)0x0) && (0 < *klag)) {
    pdVar6 = (double *)(ulong)(uint)*klag;
  }
  pdVar8 = local_38 + 1;
  iVar5 = strcmp(model,"trend");
  n = (int)pdVar6;
  if (iVar5 == 0) {
    dVar13 = (double)(local_50._0_4_ * local_50._0_4_);
    *cval = -47.44 / dVar13 + -8.353 / local_48 + -3.9638;
    cval[1] = -17.83 / dVar13 + -4.039 / local_48 + -3.4126;
    cval[2] = -7.58 / dVar13 + -2.418 / local_48 + -3.1279;
    *cprobs = 0.01;
    cprobs[1] = 0.05;
    cprobs[2] = 0.1;
    lVar12 = (long)local_50._0_4_;
    sVar11 = lVar12 * 8;
    __src = malloc(sVar11);
    res_00 = (double *)malloc(sVar11);
    if (1 < local_40._0_4_) {
      uVar7 = 1;
      do {
        res_00[uVar7 - 1] = (double)(int)uVar7;
        *(double *)((long)__src + uVar7 * 8 + -8) = (double)(int)uVar7 - local_48 * 0.5;
        uVar7 = uVar7 + 1;
      } while (((ulong)local_40 & 0xffffffff) != uVar7);
    }
    pdVar9 = (double *)malloc(0x48);
    local_110 = (double *)malloc(lVar12 << 4);
    local_68._0_8_ = lVar12;
    res = (double *)malloc(sVar11);
    memcpy(local_110,local_38,sVar11);
    memcpy(local_110 + local_68._0_8_,__src,sVar11);
    dVar15 = local_50;
    iVar5 = local_50._0_4_;
    obj = reg_init(local_50._0_4_,3);
    regress(obj,local_110,pdVar8,res,pdVar9,0.95);
    dVar24 = obj->beta[0].value;
    dVar1 = obj[1].sigma_upper;
    dVar14 = obj->beta[0].stdErr;
    dVar25 = obj[1].R2[0];
    dVar17 = mean(pdVar8,iVar5);
    sig = 0.0;
    dVar26 = 0.0;
    local_58 = 0.0;
    dVar23 = 0.0;
    dVar22 = 0.0;
    if (1 < local_40._0_4_) {
      uVar7 = 0;
      sig = 0.0;
      do {
        sig = sig + res[uVar7] * res[uVar7];
        dVar16 = pdVar8[uVar7];
        dVar26 = dVar26 + (dVar16 - dVar17) * (dVar16 - dVar17);
        dVar22 = dVar22 + dVar16;
        local_58 = local_58 + dVar16 * dVar16;
        dVar23 = dVar23 + dVar16 * res_00[uVar7];
        uVar7 = uVar7 + 1;
      } while (((ulong)dVar15 & 0xffffffff) != uVar7);
    }
    local_40 = dVar22;
    dVar15 = pow(local_48,-2.5);
    dVar17 = pow(local_48,-1.5);
    __ptr = malloc((long)n * 4);
    sVar11 = (long)n << 3;
    local_d0 = (double *)malloc(sVar11);
    local_100 = (double *)malloc(sVar11);
    if (0 < n) {
      pdVar8 = (double *)0x0;
      do {
        pdVar10 = (double *)((long)pdVar8 + 1);
        *(int *)((long)__ptr + (long)pdVar8 * 4) = (int)pdVar10;
        pdVar8 = pdVar10;
      } while (pdVar6 != pdVar10);
    }
    local_68._0_8_ = 1.0 / local_48;
    local_70 = 1.0 / dVar13;
    iVar5 = local_50._0_4_;
    if (0 < n) {
      pdVar10 = (double *)0x0;
      pdVar8 = local_d0;
      local_38 = pdVar6;
      do {
        iVar2 = *(int *)((long)__ptr + (long)pdVar10 * 4);
        mmult(res + iVar2,res,pdVar8,1,iVar5 - iVar2,1);
        pdVar10 = (double *)((long)pdVar10 + 1);
        pdVar8 = pdVar8 + 1;
      } while (local_38 != pdVar10);
    }
    sig = sig * (double)local_68._0_8_;
    local_58 = local_58 * local_70;
    dVar23 = dVar23 * dVar15;
    local_40 = local_40 * dVar17;
    if (0 < n) {
      pdVar8 = (double *)0x0;
      do {
        local_100[(long)pdVar8] =
             1.0 - (double)*(int *)((long)__ptr + (long)pdVar8 * 4) / (double)(n + 1);
        pdVar8 = (double *)((long)pdVar8 + 1);
      } while (pdVar6 != pdVar8);
    }
    mmult(local_100,local_d0,&local_90,1,n,1);
    dVar15 = (local_90 + local_90) / local_48 + sig;
    local_90 = dVar15;
    dVar17 = pow(local_48,-2.0);
    local_68._0_8_ =
         ((double)local_68._0_8_ + 1.0) * 12.0 * dVar23 * local_40 +
         dVar23 * -12.0 * dVar23 + (1.0 - dVar17) * local_58;
    dVar17 = sig / local_90;
    pdVar6 = (double *)((2.0 / dVar13 + 6.0 / local_48 + 4.0) * local_40 * local_40);
    if (dVar17 < 0.0) {
      local_38 = pdVar6;
      local_50 = sqrt(dVar17);
      pdVar6 = local_38;
    }
    else {
      local_50 = SQRT(dVar17);
    }
    local_68._0_8_ = (double)local_68._0_8_ - (double)pdVar6;
    if (local_90 < 0.0) {
      local_38 = (double *)sqrt(local_90);
      dVar13 = (double)local_68._0_8_;
    }
    else {
      local_38 = (double *)SQRT(local_90);
      dVar13 = (double)local_68._0_8_;
    }
    dVar17 = dVar15 - sig;
    if (dVar13 < 0.0) {
      local_58 = sqrt(dVar13);
      dVar13 = (double)local_68._0_8_;
    }
    else {
      local_58 = SQRT(dVar13);
    }
    dVar17 = dVar17 * 0.5;
    dVar13 = local_40 * local_40 + dVar13;
    if (dVar13 < 0.0) {
      dVar13 = sqrt(dVar13);
    }
    else {
      dVar13 = SQRT(dVar13);
    }
    dVar15 = -dVar17 / dVar15;
    dVar22 = sig / local_90;
    if (dVar22 < 0.0) {
      local_38 = (double *)((double)local_38 * dVar15);
      dVar22 = sqrt(dVar22);
      pdVar6 = local_38;
    }
    else {
      dVar22 = SQRT(dVar22);
      pdVar6 = (double *)((double)local_38 * dVar15);
    }
    uVar18 = SUB84(local_40,0);
    uVar19 = (undefined4)((ulong)local_40 >> 0x20);
    if (local_90 < 0.0) {
      local_58 = local_58 * dVar13;
      local_38 = (double *)((double)pdVar6 * local_40);
      dVar16 = sqrt(local_90);
      uVar18 = SUB84(local_40,0);
      uVar19 = (undefined4)((ulong)local_40 >> 0x20);
      pdVar6 = local_38;
      dVar13 = local_58;
    }
    else {
      dVar16 = SQRT(local_90);
      pdVar6 = (double *)((double)pdVar6 * local_40);
      dVar13 = local_58 * dVar13;
    }
    dVar4 = (double)CONCAT44(uVar19,uVar18) * 0.5;
    dVar24 = local_50 * (dVar24 / dVar14);
    dVar14 = (double)local_68._0_8_ / 12.0;
    if (dVar14 < 0.0) {
      local_70 = local_70 * dVar26;
      local_50 = dVar24;
      local_40 = dVar4;
      local_38 = (double *)((double)pdVar6 / dVar13);
      pdVar8 = (double *)sqrt(dVar14);
      dVar14 = local_70;
      dVar24 = local_50;
      pdVar6 = local_38;
      dVar4 = local_40;
    }
    else {
      pdVar8 = (double *)SQRT(dVar14);
      dVar14 = local_70 * dVar26;
      pdVar6 = (double *)((double)pdVar6 / dVar13);
    }
    if (dVar14 < 0.0) {
      local_50 = dVar24 + (double)pdVar6;
      local_40 = dVar4 - dVar23;
      local_38 = pdVar8;
      dVar14 = sqrt(dVar14);
      dVar24 = local_50;
      pdVar8 = local_38;
      dVar13 = local_40;
    }
    else {
      dVar14 = SQRT(dVar14);
      dVar24 = dVar24 + (double)pdVar6;
      dVar13 = dVar4 - dVar23;
    }
    *auxstat = dVar24;
    auxstat[1] = dVar22 * (dVar1 / dVar25) + (dVar13 * dVar16 * dVar15) / ((double)pdVar8 * dVar14);
    *laux = 2;
    iVar5 = strcmp(type,"Z-tau");
    if (iVar5 == 0) {
      local_38 = (double *)((*(double *)(obj + 1) + -1.0) / obj[1].sigma_lower);
      dVar13 = sig / local_90;
      if (dVar13 < 0.0) {
        local_48 = sqrt(dVar13);
      }
      else {
        local_48 = SQRT(dVar13);
      }
      if (local_90 < 0.0) {
        dVar13 = sqrt(local_90);
      }
      else {
        dVar13 = SQRT(local_90);
      }
      if ((double)local_68._0_8_ < 0.0) {
        local_40 = dVar13;
        dVar24 = sqrt((double)local_68._0_8_);
        dVar13 = local_40;
      }
      else {
        dVar24 = SQRT((double)local_68._0_8_);
      }
      *teststat = local_48 * (double)local_38 + (dVar15 * dVar13) / dVar24;
    }
    else {
      iVar5 = strcmp(type,"Z-alpha");
      if (iVar5 == 0) {
        *teststat = local_48 * (*(double *)(obj + 1) + -1.0) - dVar17 / (double)local_68._0_8_;
        cval[2] = NAN;
        cval[1] = NAN;
        *cval = NAN;
      }
    }
    free(__src);
    free(pdVar9);
  }
  else {
    iVar5 = strcmp(model,"constant");
    dVar13 = local_50;
    if (iVar5 != 0) {
      return;
    }
    iVar5 = local_50._0_4_;
    local_70 = (double)(local_50._0_4_ * local_50._0_4_);
    *cval = -29.25 / local_70 + -5.999 / local_48 + -3.4335;
    cval[1] = -8.36 / local_70 + -2.738 / local_48 + -2.8621;
    cval[2] = -4.48 / local_70 + -1.438 / local_48 + -2.5671;
    *cprobs = 0.01;
    cprobs[1] = 0.05;
    cprobs[2] = 0.1;
    local_110 = (double *)malloc(0x20);
    sVar11 = (long)iVar5 << 3;
    res = (double *)malloc(sVar11);
    res_00 = (double *)malloc(sVar11);
    memcpy(res,local_38,sVar11);
    obj = reg_init(iVar5,2);
    regress(obj,res,pdVar8,res_00,local_110,0.95);
    dVar24 = obj->beta[0].value;
    dVar1 = obj->beta[0].stdErr;
    dVar14 = mean(pdVar8,iVar5);
    dVar25 = 0.0;
    local_58 = 0.0;
    sig = 0.0;
    local_68._0_8_ = 0.0;
    if (1 < local_40._0_4_) {
      uVar7 = 0;
      local_68._0_8_ = 0.0;
      do {
        dVar25 = dVar25 + res_00[uVar7] * res_00[uVar7];
        dVar15 = pdVar8[uVar7];
        local_58 = local_58 + (dVar15 - dVar14) * (dVar15 - dVar14);
        local_68._0_8_ = (double)local_68._0_8_ + dVar15;
        sig = sig + dVar15 * dVar15;
        uVar7 = uVar7 + 1;
      } while (((ulong)dVar13 & 0xffffffff) != uVar7);
    }
    dVar13 = pow(local_48,-1.5);
    __ptr = malloc((long)n * 4);
    sVar11 = (long)n * 8;
    local_d0 = (double *)malloc(sVar11);
    local_100 = (double *)malloc(sVar11);
    if (0 < n) {
      pdVar8 = (double *)0x0;
      do {
        pdVar9 = (double *)((long)pdVar8 + 1);
        *(int *)((long)__ptr + (long)pdVar8 * 4) = (int)pdVar9;
        pdVar8 = pdVar9;
      } while (pdVar6 != pdVar9);
    }
    local_40 = 1.0 / local_48;
    iVar5 = local_50._0_4_;
    local_38 = pdVar6;
    if (0 < n) {
      pdVar9 = (double *)0x0;
      pdVar8 = local_d0;
      do {
        iVar2 = *(int *)((long)__ptr + (long)pdVar9 * 4);
        mmult(res_00 + iVar2,res_00,pdVar8,1,iVar5 - iVar2,1);
        pdVar9 = (double *)((long)pdVar9 + 1);
        pdVar8 = pdVar8 + 1;
      } while (local_38 != pdVar9);
    }
    local_40 = local_40 * dVar25;
    if (0 < n) {
      pdVar6 = (double *)0x0;
      do {
        local_100[(long)pdVar6] =
             1.0 - (double)*(int *)((long)__ptr + (long)pdVar6 * 4) / (double)(n + 1);
        pdVar6 = (double *)((long)pdVar6 + 1);
      } while (local_38 != pdVar6);
    }
    local_38 = (double *)(1.0 / local_70);
    mmult(local_100,local_d0,&local_90,1,n,1);
    local_90 = (local_90 + local_90) / local_48 + local_40;
    dVar14 = local_40 / local_90;
    local_50 = local_90;
    if (dVar14 < 0.0) {
      dVar14 = sqrt(dVar14);
    }
    else {
      dVar14 = SQRT(dVar14);
    }
    uVar18 = SUB84(local_38,0);
    uVar19 = (undefined4)((ulong)local_38 >> 0x20);
    sig = sig * (double)local_38;
    if (local_90 < 0.0) {
      local_70 = sqrt(local_90);
      uVar18 = SUB84(local_38,0);
      uVar19 = (undefined4)((ulong)local_38 >> 0x20);
      dVar25 = sig;
    }
    else {
      local_70 = SQRT(local_90);
      dVar25 = sig;
    }
    uVar20 = 0;
    uVar21 = 0;
    sig = local_50 - local_40;
    local_38 = (double *)((double)CONCAT44(uVar19,uVar18) * local_58);
    if (dVar25 < 0.0) {
      dStack_80 = 0.0;
      dVar25 = sqrt(dVar25);
      uVar20 = sig._8_4_;
      uVar21 = sig._12_4_;
    }
    else {
      dVar25 = SQRT(dVar25);
    }
    dVar15 = sig * 0.5;
    unique0x100012d1 = uVar20;
    sig = dVar15;
    unique0x100012d5 = uVar21;
    if ((double)local_38 < 0.0) {
      local_68._0_8_ = (double)local_68._0_8_ * dVar13;
      local_58 = dVar25;
      dVar17 = sqrt((double)local_38);
      dVar15 = sig;
      uVar20 = sig._8_4_;
      uVar21 = sig._12_4_;
      dVar25 = local_58;
    }
    else {
      dVar17 = SQRT((double)local_38);
      local_68._0_8_ = (double)local_68._0_8_ * dVar13;
    }
    auVar3._8_4_ = uVar20;
    auVar3._0_8_ = -dVar15 / local_50;
    auVar3._12_4_ = uVar21 ^ 0x80000000;
    *auxstat = dVar14 * (dVar24 / dVar1) +
               ((double)local_68._0_8_ * local_70 * (-dVar15 / local_50)) / (dVar25 * dVar17);
    *laux = 1;
    local_68 = auVar3;
    iVar5 = strcmp(type,"Z-tau");
    if (iVar5 == 0) {
      local_48 = (*(double *)(obj + 1) + -1.0) / obj[1].sigma_lower;
      dVar13 = local_40 / local_90;
      if (dVar13 < 0.0) {
        local_40 = sqrt(dVar13);
      }
      else {
        local_40 = SQRT(dVar13);
      }
      if (local_90 < 0.0) {
        pdVar6 = (double *)sqrt(local_90);
      }
      else {
        pdVar6 = (double *)SQRT(local_90);
      }
      pdVar8 = local_38;
      if ((double)local_38 < 0.0) {
        local_38 = pdVar6;
        dVar13 = sqrt((double)pdVar8);
        pdVar6 = local_38;
      }
      else {
        dVar13 = SQRT((double)local_38);
      }
      *teststat = local_40 * local_48 + ((double)local_68._0_8_ * (double)pdVar6) / dVar13;
    }
    else {
      iVar5 = strcmp(type,"Z-alpha");
      if (iVar5 == 0) {
        *teststat = local_48 * (*(double *)(obj + 1) + -1.0) - sig / (double)local_38;
        cval[2] = NAN;
        cval[1] = NAN;
        *cval = NAN;
      }
    }
  }
  free(local_110);
  free(res);
  free(res_00);
  free(__ptr);
  free(local_d0);
  free(local_100);
  free_reg(obj);
  return;
}

Assistant:

void ur_pp2(double *x, int N,const char* type,const char* model,int lshort, int *klag,double *cval,double *cprobs, double *auxstat,int *laux,double *teststat) {
    /* 
    ur_pp2
    C version of the R code by
    Bernhard Pfaff [aut, cre], Eric Zivot [ctb], Matthieu Stigler [ctb]. urca: Unit Root and Cointegration Tests for Time Series Data
    License Information : https://cran.r-project.org/web/packages/urca/urca.pdf
    */
    double *y,*y_li,*trend,*XX,*varcovar,*res,*tt,*coprods,*weights;
    int *idx;
    int N1, lmax, i,p, N12,len,iter;
    double N1d,at,my_tstat,beta_tstat,s,sum_res,sum_ymy,sum_y2,ymean,tstat;
    double myybar,myy,mty,my,sum_y,sig,lambda,lambda_prime,M,my_stat,beta_stat;
    reg_object fit;

    N1 = N - 1;
    y = &x[1];// length N1
    y_li = &x[0];// Length N1

    if (lshort == 1) {
        lmax = (int) 4.0 * pow(((double) N1)/100.0,0.25);
    } else {
        lmax = (int) 12.0 * pow(((double) N1)/100.0,0.25);
    }

    if (klag != NULL && *klag > 0) {
        lmax = *klag;
    }

    if (!strcmp(model,"trend")) {
        cval[0] = -3.9638-8.353/N1-47.44/(N1*N1);
        cval[1] = -3.4126-4.039/N1-17.83/(N1*N1);
        cval[2] = -3.1279-2.418/N1-7.58/(N1*N1);
        cprobs[0] = 0.01;
        cprobs[1] = 0.05;
        cprobs[2] = 0.1;

        //mdisplay(cval,1,3);
        trend = (double*)malloc(sizeof(double)*N1);
        tt = (double*)malloc(sizeof(double)*N1);
        N1d = (double) N1 / 2.0;

        for(i = 1; i <= N1;++i) {
            trend[i-1] = (double)i - N1d;
            tt[i-1] = (double) i;
        } 

        p = 3;
        varcovar = (double*)malloc(sizeof(double)*p*p);
        XX = (double*)malloc(sizeof(double)*2*N1);
        res = (double*)malloc(sizeof(double)*N1);

        memcpy(XX,y_li,sizeof(double)*N1);
        memcpy(XX+N1,trend,sizeof(double)*N1);

        at = 0.95;

        fit = reg_init(N1,p);

        regress(fit,XX,y,res,varcovar,at);

        /*summary(fit);
        anova(fit);
        mdisplay(res,1,N1);
        mdisplay(XX,2,N1);
        mdisplay(y,1,N1);
        */

        my_tstat = (fit->beta+0)->value/(fit->beta+0)->stdErr;
        beta_tstat = (fit->beta+2)->value/(fit->beta+2)->stdErr;

        //printf("c1 %g c2 %g \n",my_tstat,beta_tstat);

        sum_res = 0.0;
        sum_ymy = 0.0;
        sum_y2 = 0.0;
        sum_y = 0.0;
        mty = 0.0;

        ymean = mean(y,N1);
        N12 = N1 * N1;

        for(i = 0; i < N1;++i) {
            sum_res += (res[i] *res[i]);
            sum_ymy += (y[i] - ymean)*(y[i] - ymean);
            sum_y2 += (y[i] *y[i]);
            mty += (tt[i]*y[i]);
            sum_y += y[i];
        }

        s = 1.0 /(double)N1 * sum_res;
        myybar = 1.0 / (double) N12 *sum_ymy;
        myy = 1.0 / (double) N12 *sum_y2;
        mty = pow((double)N1, -2.5) * mty;
        my = pow((double)N1, -1.5) * sum_y;

        //printf("c1 %g c2 %g s %g sum_ymy %g sum_y2 %g mty %g my %g \n",my_tstat,beta_tstat,s,myybar,myy,mty,my);

        idx = (int*)malloc(sizeof(int)*lmax);
        coprods = (double*)malloc(sizeof(double)*lmax);
        weights = (double*)malloc(sizeof(double)*lmax);

        for(i = 0; i < lmax;++i) {
            idx[i] = i+1;
        }

        for(i = 0; i < lmax;++i) {
            iter = idx[i];
            len = N1 - iter;
            mmult(res+iter,res,coprods+i,1,len,1);
        }

        for(i = 0; i < lmax;++i) {
            weights[i] = 1.0 - (double) idx[i] / (double) (lmax+1);
        }

        //mdisplay(weights,1,lmax);

        mmult(weights,coprods,&sig,1,lmax,1);

        sig = s + 2.0 * sig / (double) N1;
        lambda = 0.5 * (sig - s);
        lambda_prime = lambda/sig;
        M = (1-pow((double)N1, -2.0))*myy - 12*mty*mty + 12.0*(1.0 + 1.0/(double)N1)*mty*my - (4 + 6/(double)N1 + 2/(double)(N1*N1))*my*my;
        my_stat = sqrt(s/sig)*my_tstat - lambda_prime*sqrt(sig)*my/(sqrt(M)*sqrt((M+my*my)));
        beta_stat = sqrt(s/sig)*beta_tstat - lambda_prime*sqrt(sig)*(0.5*my - mty)/(sqrt(M/12)*sqrt(myybar));
        auxstat[0] = my_stat;
        auxstat[1] = beta_stat;

        *laux = 2;

        if (!strcmp(type,"Z-tau")) {
            tstat = ((fit->beta+1)->value - 1.0)/(fit->beta+1)->stdErr;
            *teststat = sqrt(s/sig)*tstat-lambda_prime*sqrt(sig)/sqrt(M);
        } else if (!strcmp(type,"Z-alpha")) {
            *teststat = (double)N1 * ((fit->beta+1)->value - 1.0) - lambda/M;
            cval[0] = cval[1] = cval[2] = NAN;
        }

        //printf("sig %g lambda %g lambda_prime %g M %g my_stat %g beta_stat %g teststat %g \n",sig,lambda,lambda_prime,M,my_stat,beta_stat,*teststat);


        free(trend);
        free(varcovar);
        free(XX);
        free(res);
        free(tt);
        free(idx);
        free(coprods);
        free(weights);
        free_reg(fit);
    } else if (!strcmp(model,"constant")) {
        cval[0] = -3.4335-5.999/(double)N1-29.25/(double)(N1*N1);
        cval[1] = -2.8621-2.738/(double)N1-8.36/(double)(N1*N1);
        cval[2] = -2.5671-1.438/(double)N1-4.48/(double)(N1*N1);
        cprobs[0] = 0.01;
        cprobs[1] = 0.05;
        cprobs[2] = 0.1;

        //mdisplay(cval,1,3);

        p = 2;
        varcovar = (double*)malloc(sizeof(double)*p*p);
        XX = (double*)malloc(sizeof(double)*N1);
        res = (double*)malloc(sizeof(double)*N1);

        memcpy(XX,y_li,sizeof(double)*N1);

        at = 0.95;

        fit = reg_init(N1,p);

        regress(fit,XX,y,res,varcovar,at);

        //summary(fit);
        //anova(fit);
        //mdisplay(res,1,N1);
        //mdisplay(XX,2,N1);
        //mdisplay(y,1,N1);

        my_tstat = (fit->beta+0)->value/(fit->beta+0)->stdErr;

        sum_res = 0.0;
        sum_ymy = 0.0;
        sum_y2 = 0.0;
        sum_y = 0.0;

        ymean = mean(y,N1);
        N12 = N1 * N1;

        for(i = 0; i < N1;++i) {
            sum_res += (res[i] *res[i]);
            sum_ymy += (y[i] - ymean)*(y[i] - ymean);
            sum_y2 += (y[i] *y[i]);
            sum_y += y[i];
        }

        s = 1.0 /(double)N1 * sum_res;
        myybar = 1.0 / (double) N12 *sum_ymy;
        myy = 1.0 / (double) N12 *sum_y2;
        my = pow((double)N1, -1.5) * sum_y;

        //printf("c1 %g s %g sum_ymy %g sum_y2 %g my %g \n",my_tstat,s,myybar,myy,my);

        idx = (int*)malloc(sizeof(int)*lmax);
        coprods = (double*)malloc(sizeof(double)*lmax);
        weights = (double*)malloc(sizeof(double)*lmax);

        for(i = 0; i < lmax;++i) {
            idx[i] = i+1;
        }

        for(i = 0; i < lmax;++i) {
            iter = idx[i];
            len = N1 - iter;
            mmult(res+iter,res,coprods+i,1,len,1);
        }

        for(i = 0; i < lmax;++i) {
            weights[i] = 1.0 - (double) idx[i] / (double) (lmax+1);
        }

        //mdisplay(coprods,1,lmax);

        //mdisplay(weights,1,lmax);

        mmult(weights,coprods,&sig,1,lmax,1);

        sig = s + 2.0 * sig / (double) N1;
        lambda = 0.5 * (sig - s);
        lambda_prime = lambda/sig;

        my_stat = sqrt(s/sig)*my_tstat - lambda_prime*sqrt(sig)*my/(sqrt(myy)*sqrt(myybar));
        auxstat[0] = my_stat;
        *laux = 1;

        if (!strcmp(type,"Z-tau")) {
            tstat = ((fit->beta+1)->value - 1.0)/(fit->beta+1)->stdErr;
            *teststat = sqrt(s/sig)*tstat-lambda_prime*sqrt(sig)/sqrt(myybar);
        } else if (!strcmp(type,"Z-alpha")) {
            *teststat = (double)N1 * ((fit->beta+1)->value - 1.0) - lambda/myybar;
            cval[0] = cval[1] = cval[2] = NAN;
        }

        //printf("sig %g lambda %g lambda_prime %g my_stat %g teststat %g \n",sig,lambda,lambda_prime,my_stat,*teststat);
        



        free(varcovar);
        free(XX);
        free(res);
        free(idx);
        free(coprods);
        free(weights);
        free_reg(fit);
    }
}